

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O0

int skipBOM(LoadF *lf)

{
  uint uVar1;
  int iVar2;
  byte *pbVar3;
  char *pcStack_20;
  int c;
  char *p;
  LoadF *lf_local;
  
  pcStack_20 = anon_var_dwarf_3307;
  lf->n = 0;
  while( true ) {
    uVar1 = getc((FILE *)lf->f);
    if (uVar1 == 0xffffffff) {
      return -1;
    }
    pbVar3 = (byte *)pcStack_20 + 1;
    if (uVar1 != (byte)*pcStack_20) break;
    iVar2 = lf->n;
    lf->n = iVar2 + 1;
    lf->buff[iVar2] = (char)uVar1;
    pcStack_20 = (char *)pbVar3;
    if (*pbVar3 == 0) {
      lf->n = 0;
      iVar2 = getc((FILE *)lf->f);
      return iVar2;
    }
  }
  return uVar1;
}

Assistant:

static int skipBOM (LoadF *lf) {
  const char *p = "\xEF\xBB\xBF";  /* UTF-8 BOM mark */
  int c;
  lf->n = 0;
  do {
    c = getc(lf->f);
    if (c == EOF || c != *(const unsigned char *)p++) return c;
    lf->buff[lf->n++] = c;  /* to be read by the parser */
  } while (*p != '\0');
  lf->n = 0;  /* prefix matched; discard it */
  return getc(lf->f);  /* return next character */
}